

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u16 cellSizePtr(MemPage *pPage,u8 *pCell)

{
  ulong uVar1;
  uchar *puVar2;
  ushort uVar3;
  byte bVar4;
  u16 uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uchar *p;
  u32 local_1c;
  
  p = pCell + pPage->childPtrSize;
  if (pPage->intKey == '\0') {
    if ((char)*p < '\0') {
      bVar4 = sqlite3GetVarint32(p,&local_1c);
      uVar6 = (uint)bVar4;
    }
    else {
      uVar6 = 1;
      local_1c = (int)(char)*p;
    }
    iVar8 = (int)p + uVar6;
  }
  else {
    if (pPage->hasData == '\0') {
      local_1c = 0;
    }
    else {
      if ((char)*p < '\0') {
        bVar4 = sqlite3GetVarint32(p,&local_1c);
        uVar7 = (ulong)bVar4;
      }
      else {
        uVar7 = 1;
        local_1c = (int)(char)*p;
      }
      p = p + uVar7;
    }
    uVar7 = 0;
    do {
      uVar1 = uVar7 + 1;
      if (7 < uVar7) break;
      puVar2 = p + uVar7;
      uVar7 = uVar1;
    } while ((char)*puVar2 < '\0');
    iVar8 = (int)p + (int)uVar1;
  }
  if (pPage->maxLocal < local_1c) {
    uVar3 = pPage->minLocal;
    local_1c = (local_1c - uVar3) % (pPage->pBt->usableSize - 4) + (uint)uVar3;
    if (pPage->maxLocal < local_1c) {
      local_1c = (u32)uVar3;
    }
    local_1c = local_1c + 4;
  }
  local_1c = (iVar8 - (int)pCell) + local_1c;
  uVar5 = 4;
  if (4 < local_1c) {
    uVar5 = (u16)local_1c;
  }
  return uVar5;
}

Assistant:

static u16 cellSizePtr(MemPage *pPage, u8 *pCell){
  u8 *pIter = &pCell[pPage->childPtrSize];
  u32 nSize;

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  btreeParseCellPtr(pPage, pCell, &debuginfo);
#endif

  if( pPage->intKey ){
    u8 *pEnd;
    if( pPage->hasData ){
      pIter += getVarint32(pIter, nSize);
    }else{
      nSize = 0;
    }

    /* pIter now points at the 64-bit integer key value, a variable length 
    ** integer. The following block moves pIter to point at the first byte
    ** past the end of the key value. */
    pEnd = &pIter[9];
    while( (*pIter++)&0x80 && pIter<pEnd );
  }else{
    pIter += getVarint32(pIter, nSize);
  }

  testcase( nSize==pPage->maxLocal );
  testcase( nSize==pPage->maxLocal+1 );
  if( nSize>pPage->maxLocal ){
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4;
  }
  nSize += (u32)(pIter - pCell);

  /* The minimum size of any cell is 4 bytes. */
  if( nSize<4 ){
    nSize = 4;
  }

  assert( nSize==debuginfo.nSize );
  return (u16)nSize;
}